

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

int STRING_concat(STRING_HANDLE handle,char *s2)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  LOGGER_LOG p_Var4;
  size_t local_68;
  long local_60;
  ulong local_58;
  LOGGER_LOG l;
  char *temp;
  size_t realloc_size;
  size_t s2Length;
  size_t s1Length;
  STRING *s1;
  int result;
  char *s2_local;
  STRING_HANDLE handle_local;
  
  if ((handle == (STRING_HANDLE)0x0) || (s2 == (char *)0x0)) {
    s1._4_4_ = 0x196;
  }
  else {
    sVar1 = strlen(handle->s);
    sVar2 = strlen(s2);
    if (sVar1 < -sVar2 - 1) {
      local_58 = sVar1 + sVar2;
    }
    else {
      local_58 = 0xffffffffffffffff;
    }
    if (local_58 < 0xfffffffffffffffe) {
      if (sVar1 < -sVar2 - 1) {
        local_60 = sVar1 + sVar2;
      }
      else {
        local_60 = -1;
      }
      local_68 = local_60 + 1;
    }
    else {
      local_68 = 0xffffffffffffffff;
    }
    if ((local_68 == 0xffffffffffffffff) ||
       (pcVar3 = (char *)realloc(handle->s,local_68), pcVar3 == (char *)0x0)) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/src/strings.c"
                  ,"STRING_concat",0x1a3,1,"Failure reallocating value. size=%zu",local_68);
      }
      s1._4_4_ = 0x1a4;
    }
    else {
      handle->s = pcVar3;
      memcpy(handle->s + sVar1,s2,sVar2 + 1);
      s1._4_4_ = 0;
    }
  }
  return s1._4_4_;
}

Assistant:

int STRING_concat(STRING_HANDLE handle, const char* s2)
{
    int result;
    if ((handle == NULL) || (s2 == NULL))
    {
        /* Codes_SRS_STRING_07_013: [STRING_concat shall return a nonzero number if an error is encountered.] */
        result = MU_FAILURE;
    }
    else
    {
        STRING* s1 = (STRING*)handle;
        size_t s1Length = strlen(s1->s);
        size_t s2Length = strlen(s2);
        size_t realloc_size = safe_add_size_t(safe_add_size_t(s1Length, s2Length), 1);
        char* temp;
        if (realloc_size == SIZE_MAX ||
            (temp = (char*)realloc(s1->s, realloc_size)) == NULL)
        {
            /* Codes_SRS_STRING_07_013: [STRING_concat shall return a nonzero number if an error is encountered.] */
            LogError("Failure reallocating value. size=%zu", realloc_size);
            result = MU_FAILURE;
        }
        else
        {
            s1->s = temp;
            (void)memcpy(s1->s + s1Length, s2, s2Length + 1);
            result = 0;
        }
    }
    return result;
}